

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  const_reference data;
  size_type length;
  size_t sVar1;
  undefined4 in_register_00000034;
  ScopedWriteLock local_20;
  ScopedWriteLock lock;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)CONCAT44(in_register_00000034,__fd);
  ScopedWriteLock::ScopedWriteLock(&local_20,this->pimpl_);
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)lock.pimpl_,0);
  length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)lock.pimpl_);
  sVar1 = write_(this,data,length);
  ScopedWriteLock::~ScopedWriteLock(&local_20);
  return sVar1;
}

Assistant:

size_t
Serial::write (const std::vector<uint8_t> &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (&data[0], data.size());
}